

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l2_norm(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  quad *pqVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  if (n == 0) {
    auVar6 = ZEXT864(0);
  }
  else {
    auVar6 = ZEXT864(0);
    uVar3 = 0;
    do {
      auVar7 = ZEXT416((uint)(this->linear_elements)._M_t.
                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar3]);
      auVar7 = vfmadd231ss_fma(auVar6._0_16_,auVar7,auVar7);
      auVar6 = ZEXT1664(auVar7);
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  uVar3 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      auVar7 = ZEXT416((uint)(this->quadratic_elements)._M_t.
                             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                             .
                             super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                             ._M_head_impl[uVar4].factor);
      auVar7 = vfmadd231ss_fma(auVar6._0_16_,auVar7,auVar7);
      auVar6 = ZEXT1664(auVar7);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  fVar5 = auVar6._0_4_;
  if ((int)ABS(fVar5) - 0x800000U < 0x7f000000) {
    if (n != 0) {
      pfVar1 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      uVar4 = 0;
      do {
        pfVar1[uVar4] = pfVar1[uVar4] / fVar5;
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
    }
    if (uVar3 != 0) {
      pqVar2 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl;
      uVar4 = 0;
      do {
        pqVar2[uVar4].factor = pqVar2[uVar4].factor / fVar5;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }